

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument_pass.cpp
# Opt level: O1

void __thiscall
spvtools::opt::InstrumentPass::MovePreludeCode
          (InstrumentPass *this,iterator *ref_inst_itr,
          UptrVectorIterator<spvtools::opt::BasicBlock,_false> ref_block_itr,
          unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
          *new_blk_ptr)

{
  DebugScope *pDVar1;
  BasicBlock *pBVar2;
  __uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
  _Var3;
  Instruction *pIVar4;
  uint32_t uVar5;
  undefined8 in_RAX;
  BasicBlock *pBVar6;
  mapped_type *ppIVar7;
  UnderlyingIterator UVar8;
  Instruction *sb_inst_ptr;
  Instruction *pIVar9;
  undefined8 uStack_38;
  
  UVar8 = ref_block_itr.iterator_._M_current;
  uStack_38 = in_RAX;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(this->same_block_pre_)._M_h);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(this->same_block_post_)._M_h);
  pBVar6 = (BasicBlock *)operator_new(0x88);
  pBVar2 = ((UVar8._M_current)->_M_t).
           super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
           .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
  _Var3.
  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
       (pBVar2->label_)._M_t.
       super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ;
  (pBVar2->label_)._M_t.
  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
       = (__uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
          )0x0;
  pBVar6->function_ = (Function *)0x0;
  (pBVar6->label_)._M_t.
  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
       = _Var3.
         super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
         ._M_t.
         super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
         .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  pIVar9 = (Instruction *)
           ((long)&(pBVar6->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 8);
  *(Instruction **)((long)&(pBVar6->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10)
       = (Instruction *)0x0;
  *(Instruction **)((long)&(pBVar6->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 0x18)
       = (Instruction *)0x0;
  (((Instruction *)((long)&(pBVar6->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 8))->
  super_IntrusiveNodeBase<spvtools::opt::Instruction>)._vptr_IntrusiveNodeBase =
       (_func_int **)&PTR__Instruction_003e9ae0;
  *(uint32_t *)((long)&(pBVar6->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 0x38) = 0;
  *(IRContext **)((long)&(pBVar6->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 0x28) =
       (IRContext *)0x0;
  *(undefined8 *)((long)&(pBVar6->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 0x2e) =
       0;
  *(undefined8 *)
   &(((OperandList *)
     ((long)&(pBVar6->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 0x40))->
    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>)._M_impl = 0
  ;
  *(pointer *)((long)&(pBVar6->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 0x48) =
       (pointer)0x0;
  *(pointer *)((long)&(pBVar6->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 0x50) =
       (pointer)0x0;
  *(undefined8 *)
   &(((vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_> *)
     ((long)&(pBVar6->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 0x58))->
    super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>).
    _M_impl = 0;
  *(pointer *)((long)&(pBVar6->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 0x60) =
       (pointer)0x0;
  *(pointer *)((long)&(pBVar6->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 0x68) =
       (pointer)0x0;
  pDVar1 = (DebugScope *)
           ((long)&(pBVar6->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 0x70);
  pDVar1->lexical_scope_ = 0;
  pDVar1->inlined_at_ = 0;
  *(Instruction **)((long)&(pBVar6->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10)
       = pIVar9;
  *(Instruction **)((long)&(pBVar6->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 0x18)
       = pIVar9;
  *(bool *)((long)&(pBVar6->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 0x20) = true;
  (pBVar6->insts_).super_IntrusiveList<spvtools::opt::Instruction>._vptr_IntrusiveList =
       (_func_int **)&PTR__InstructionList_003e9b78;
  pBVar2 = (new_blk_ptr->_M_t).
           super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
           .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
  (new_blk_ptr->_M_t).
  super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>.
  _M_t.
  super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
  .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl = pBVar6;
  if (pBVar2 != (BasicBlock *)0x0) {
    std::default_delete<spvtools::opt::BasicBlock>::operator()
              ((default_delete<spvtools::opt::BasicBlock> *)new_blk_ptr,pBVar2);
  }
  pIVar9 = *(Instruction **)
            ((long)&((((UVar8._M_current)->_M_t).
                      super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                      .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl)->
                    insts_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
  if (pIVar9 != (ref_inst_itr->super_iterator).node_) {
    do {
      if ((pIVar9->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == true) {
        __assert_fail("!this->is_sentinel_ && \"Sentinel nodes cannot be moved around.\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/util/ilist_node.h"
                      ,0xca,
                      "void spvtools::utils::IntrusiveNodeBase<spvtools::opt::Instruction>::RemoveFromList() [NodeType = spvtools::opt::Instruction]"
                     );
      }
      pIVar4 = (pIVar9->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      if (pIVar4 == (Instruction *)0x0) {
        __assert_fail("this->IsInAList() && \"Cannot remove a node from a list if it is not in a list.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/util/ilist_node.h"
                      ,0xcc,
                      "void spvtools::utils::IntrusiveNodeBase<spvtools::opt::Instruction>::RemoveFromList() [NodeType = spvtools::opt::Instruction]"
                     );
      }
      (pIVar4->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_ =
           (pIVar9->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_;
      (((pIVar9->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_)->
      super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ = pIVar4;
      (pIVar9->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ = (Instruction *)0x0;
      (pIVar9->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_ =
           (Instruction *)0x0;
      if ((pIVar9->opcode_ == OpImage) || (pIVar9->opcode_ == OpSampledImage)) {
        uVar5 = 0;
        if (pIVar9->has_result_id_ == true) {
          uVar5 = Instruction::GetSingleWordOperand(pIVar9,(uint)pIVar9->has_type_id_);
        }
        uStack_38 = CONCAT44(uVar5,(undefined4)uStack_38);
        ppIVar7 = std::__detail::
                  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&this->same_block_pre_,(key_type *)((long)&uStack_38 + 4));
        *ppIVar7 = pIVar9;
      }
      utils::IntrusiveList<spvtools::opt::Instruction>::push_back
                (&(((new_blk_ptr->_M_t).
                    super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                    .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl)->insts_
                  ).super_IntrusiveList<spvtools::opt::Instruction>,pIVar9);
      pIVar9 = *(Instruction **)
                ((long)&((((UVar8._M_current)->_M_t).
                          super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                          .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl)->
                        insts_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
    } while (pIVar9 != (ref_inst_itr->super_iterator).node_);
  }
  return;
}

Assistant:

void InstrumentPass::MovePreludeCode(
    BasicBlock::iterator ref_inst_itr,
    UptrVectorIterator<BasicBlock> ref_block_itr,
    std::unique_ptr<BasicBlock>* new_blk_ptr) {
  same_block_pre_.clear();
  same_block_post_.clear();
  // Initialize new block. Reuse label from original block.
  new_blk_ptr->reset(new BasicBlock(std::move(ref_block_itr->GetLabel())));
  // Move contents of original ref block up to ref instruction.
  for (auto cii = ref_block_itr->begin(); cii != ref_inst_itr;
       cii = ref_block_itr->begin()) {
    Instruction* inst = &*cii;
    inst->RemoveFromList();
    std::unique_ptr<Instruction> mv_ptr(inst);
    // Remember same-block ops for possible regeneration.
    if (IsSameBlockOp(&*mv_ptr)) {
      auto* sb_inst_ptr = mv_ptr.get();
      same_block_pre_[mv_ptr->result_id()] = sb_inst_ptr;
    }
    (*new_blk_ptr)->AddInstruction(std::move(mv_ptr));
  }
}